

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Int i)

{
  StrWriter *this_local;
  Int i_local;
  
  sprint_signed(&this->ptr,(long)i.raw,&this->style->numberFormat);
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Int i)
{
    sprint_signed(ptr, i.raw, style.numberFormat);
    return *this;
}